

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall
FIX::HttpConnection::processRoot
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  bool bVar1;
  int iVar2;
  TABLE *pTVar3;
  TAG *pTVar4;
  ostream *poVar5;
  size_t sVar6;
  reference sessionID;
  Session *this_00;
  pointer pSVar7;
  StringField *pSVar8;
  string *psVar9;
  long lVar10;
  char *pcVar11;
  undefined1 local_30e8 [8];
  TD td_13;
  TD td_12;
  string local_2d70;
  undefined1 local_2d50 [8];
  TD td_11;
  UtcTimeStamp local_2b90;
  string local_2b78;
  undefined1 local_2b58 [8];
  TD td_10;
  string local_2998;
  undefined1 local_2978 [8];
  TD td_9;
  string local_27b8;
  undefined1 local_2798 [8];
  TD td_8;
  undefined1 local_25c0 [8];
  A a_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2388;
  undefined1 local_2368 [8];
  string href;
  TD td_7;
  TR tr_1;
  Session *pSession;
  _Base_ptr local_1fc8;
  _Rb_tree_const_iterator<FIX::SessionID> local_1fc0;
  iterator i;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  string local_1f80;
  allocator<char> local_1f59;
  string local_1f58;
  undefined1 local_1f38 [8];
  TD td_6;
  string local_1d78;
  allocator<char> local_1d51;
  string local_1d50;
  undefined1 local_1d30 [8];
  TD td_5;
  string local_1b70;
  allocator<char> local_1b49;
  string local_1b48;
  undefined1 local_1b28 [8];
  TD td_4;
  string local_1968;
  allocator<char> local_1941;
  string local_1940;
  undefined1 local_1920 [8];
  TD td_3;
  string local_1760;
  allocator<char> local_1739;
  string local_1738;
  undefined1 local_1718 [8];
  TD td_2;
  string local_1558;
  allocator<char> local_1531;
  string local_1530;
  undefined1 local_1510 [8];
  TD td_1;
  string local_1350;
  allocator<char> local_1329;
  string local_1328;
  undefined1 local_1308 [8];
  TD td;
  TR tr;
  string local_f90;
  string local_f70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f50;
  undefined1 local_f30 [8];
  A a_3;
  string local_d70;
  string local_d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  undefined1 local_d10 [8];
  A a_2;
  string local_b50;
  string local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  undefined1 local_af0 [8];
  A a_1;
  string local_930;
  string local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  undefined1 local_8d0 [8];
  A a;
  HR hr;
  EM em;
  CAPTION caption;
  undefined1 local_1e0 [8];
  TABLE table;
  stringstream *b_local;
  stringstream *h_local;
  HttpMessage *request_local;
  HttpConnection *this_local;
  
  table.super_TAG.m_stream = (ostream *)b;
  HTML::TABLE::TABLE((TABLE *)local_1e0,(ostream *)(b + 0x10));
  pTVar3 = HTML::TABLE::border((TABLE *)local_1e0,1);
  pTVar3 = HTML::TABLE::cellspacing(pTVar3,2);
  pTVar4 = &HTML::TABLE::width(pTVar3,100)->super_TAG;
  HTML::TAG::text(pTVar4);
  HTML::CAPTION::CAPTION((CAPTION *)&em.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
  HTML::TAG::text((TAG *)&em.super_TAG.m_stream);
  HTML::EM::EM((EM *)&hr.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
  HTML::TAG::text((TAG *)&hr.super_TAG.m_stream);
  poVar5 = table.super_TAG.m_stream + 0x10;
  sVar6 = Session::numSessions();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  std::operator<<(poVar5," Sessions managed by QuickFIX");
  HTML::HR::HR((HR *)&a.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
  HTML::TAG::text((TAG *)&a.super_TAG.m_stream);
  HTML::HR::~HR((HR *)&a.super_TAG.m_stream);
  std::operator<<(table.super_TAG.m_stream + 0x10,HTML::NBSP);
  HTML::A::A((A *)local_8d0,table.super_TAG.m_stream + 0x10);
  HttpMessage::getParameterString_abi_cxx11_(&local_910,request);
  std::operator+(&local_8f0,"/resetSessions",&local_910);
  pTVar4 = &HTML::A::href((A *)local_8d0,&local_8f0)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_930,"RESET",(allocator<char> *)((long)&a_1.super_TAG.m_stream + 7));
  HTML::TAG::text(pTVar4,&local_930);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a_1.super_TAG.m_stream + 7));
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_910);
  HTML::A::~A((A *)local_8d0);
  std::operator<<(table.super_TAG.m_stream + 0x10,HTML::NBSP);
  HTML::A::A((A *)local_af0,table.super_TAG.m_stream + 0x10);
  HttpMessage::getParameterString_abi_cxx11_(&local_b30,request);
  std::operator+(&local_b10,"/refreshSessions",&local_b30);
  pTVar4 = &HTML::A::href((A *)local_af0,&local_b10)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b50,"REFRESH",(allocator<char> *)((long)&a_2.super_TAG.m_stream + 7));
  HTML::TAG::text(pTVar4,&local_b50);
  std::__cxx11::string::~string((string *)&local_b50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a_2.super_TAG.m_stream + 7));
  std::__cxx11::string::~string((string *)&local_b10);
  std::__cxx11::string::~string((string *)&local_b30);
  HTML::A::~A((A *)local_af0);
  std::operator<<(table.super_TAG.m_stream + 0x10,HTML::NBSP);
  HTML::A::A((A *)local_d10,table.super_TAG.m_stream + 0x10);
  HttpMessage::getParameterString_abi_cxx11_(&local_d50,request);
  std::operator+(&local_d30,"/enableSessions",&local_d50);
  pTVar4 = &HTML::A::href((A *)local_d10,&local_d30)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d70,"ENABLE",(allocator<char> *)((long)&a_3.super_TAG.m_stream + 7));
  HTML::TAG::text(pTVar4,&local_d70);
  std::__cxx11::string::~string((string *)&local_d70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a_3.super_TAG.m_stream + 7));
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d50);
  HTML::A::~A((A *)local_d10);
  std::operator<<(table.super_TAG.m_stream + 0x10,HTML::NBSP);
  HTML::A::A((A *)local_f30,table.super_TAG.m_stream + 0x10);
  HttpMessage::getParameterString_abi_cxx11_(&local_f70,request);
  std::operator+(&local_f50,"/disableSessions",&local_f70);
  pTVar4 = &HTML::A::href((A *)local_f30,&local_f50)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f90,"DISABLE",(allocator<char> *)((long)&tr.super_TAG.m_stream + 7));
  HTML::TAG::text(pTVar4,&local_f90);
  std::__cxx11::string::~string((string *)&local_f90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tr.super_TAG.m_stream + 7));
  std::__cxx11::string::~string((string *)&local_f50);
  std::__cxx11::string::~string((string *)&local_f70);
  HTML::A::~A((A *)local_f30);
  HTML::EM::~EM((EM *)&hr.super_TAG.m_stream);
  HTML::CAPTION::~CAPTION((CAPTION *)&em.super_TAG.m_stream);
  HTML::TR::TR((TR *)&td.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
  HTML::TAG::text((TAG *)&td.super_TAG.m_stream);
  HTML::TD::TD((TD *)local_1308,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1328,"center",&local_1329);
  pTVar4 = &HTML::TD::align((TD *)local_1308,&local_1328)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1350,"Session",(allocator<char> *)((long)&td_1.super_TAG.m_stream + 7)
            );
  HTML::TAG::text(pTVar4,&local_1350);
  std::__cxx11::string::~string((string *)&local_1350);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_1.super_TAG.m_stream + 7));
  std::__cxx11::string::~string((string *)&local_1328);
  std::allocator<char>::~allocator(&local_1329);
  HTML::TD::~TD((TD *)local_1308);
  HTML::TD::TD((TD *)local_1510,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1530,"center",&local_1531);
  pTVar4 = &HTML::TD::align((TD *)local_1510,&local_1530)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1558,"ConnectionType",
             (allocator<char> *)((long)&td_2.super_TAG.m_stream + 7));
  HTML::TAG::text(pTVar4,&local_1558);
  std::__cxx11::string::~string((string *)&local_1558);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_2.super_TAG.m_stream + 7));
  std::__cxx11::string::~string((string *)&local_1530);
  std::allocator<char>::~allocator(&local_1531);
  HTML::TD::~TD((TD *)local_1510);
  HTML::TD::TD((TD *)local_1718,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1738,"center",&local_1739);
  pTVar4 = &HTML::TD::align((TD *)local_1718,&local_1738)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1760,"Enabled",(allocator<char> *)((long)&td_3.super_TAG.m_stream + 7)
            );
  HTML::TAG::text(pTVar4,&local_1760);
  std::__cxx11::string::~string((string *)&local_1760);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_3.super_TAG.m_stream + 7));
  std::__cxx11::string::~string((string *)&local_1738);
  std::allocator<char>::~allocator(&local_1739);
  HTML::TD::~TD((TD *)local_1718);
  HTML::TD::TD((TD *)local_1920,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1940,"center",&local_1941);
  pTVar4 = &HTML::TD::align((TD *)local_1920,&local_1940)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1968,"Session Time",
             (allocator<char> *)((long)&td_4.super_TAG.m_stream + 7));
  HTML::TAG::text(pTVar4,&local_1968);
  std::__cxx11::string::~string((string *)&local_1968);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_4.super_TAG.m_stream + 7));
  std::__cxx11::string::~string((string *)&local_1940);
  std::allocator<char>::~allocator(&local_1941);
  HTML::TD::~TD((TD *)local_1920);
  HTML::TD::TD((TD *)local_1b28,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b48,"center",&local_1b49);
  pTVar4 = &HTML::TD::align((TD *)local_1b28,&local_1b48)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b70,"Logged On",
             (allocator<char> *)((long)&td_5.super_TAG.m_stream + 7));
  HTML::TAG::text(pTVar4,&local_1b70);
  std::__cxx11::string::~string((string *)&local_1b70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_5.super_TAG.m_stream + 7));
  std::__cxx11::string::~string((string *)&local_1b48);
  std::allocator<char>::~allocator(&local_1b49);
  HTML::TD::~TD((TD *)local_1b28);
  HTML::TD::TD((TD *)local_1d30,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d50,"center",&local_1d51);
  pTVar4 = &HTML::TD::align((TD *)local_1d30,&local_1d50)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d78,"Next Incoming",
             (allocator<char> *)((long)&td_6.super_TAG.m_stream + 7));
  HTML::TAG::text(pTVar4,&local_1d78);
  std::__cxx11::string::~string((string *)&local_1d78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_6.super_TAG.m_stream + 7));
  std::__cxx11::string::~string((string *)&local_1d50);
  std::allocator<char>::~allocator(&local_1d51);
  HTML::TD::~TD((TD *)local_1d30);
  HTML::TD::TD((TD *)local_1f38,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f58,"center",&local_1f59);
  pTVar4 = &HTML::TD::align((TD *)local_1f38,&local_1f58)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f80,"Next Outgoing",
             (allocator<char> *)
             ((long)&sessions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  HTML::TAG::text(pTVar4,&local_1f80);
  std::__cxx11::string::~string((string *)&local_1f80);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sessions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::__cxx11::string::~string((string *)&local_1f58);
  std::allocator<char>::~allocator(&local_1f59);
  HTML::TD::~TD((TD *)local_1f38);
  HTML::TR::~TR((TR *)&td.super_TAG.m_stream);
  Session::getSessions();
  std::_Rb_tree_const_iterator<FIX::SessionID>::_Rb_tree_const_iterator(&local_1fc0);
  local_1fc8 = (_Base_ptr)
               std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
               ::begin((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                        *)&i);
  local_1fc0._M_node = local_1fc8;
  while( true ) {
    pSession = (Session *)
               std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
               ::end((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                      *)&i);
    bVar1 = std::operator!=(&local_1fc0,(_Self *)&pSession);
    if (!bVar1) break;
    sessionID = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_1fc0);
    this_00 = Session::lookupSession(sessionID);
    if (this_00 != (Session *)0x0) {
      HTML::TR::TR((TR *)&td_7.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
      HTML::TAG::text((TAG *)&td_7.super_TAG.m_stream);
      HTML::TD::TD((TD *)((long)&href.field_2 + 8),table.super_TAG.m_stream + 0x10);
      HTML::TAG::text((TAG *)((long)&href.field_2 + 8));
      pSVar7 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator->(&local_1fc0);
      pSVar8 = &SessionID::getBeginString(pSVar7)->super_StringField;
      psVar9 = StringField::getValue_abi_cxx11_(pSVar8);
      std::operator+(&local_23e8,"/session?BeginString=",psVar9);
      std::operator+(&local_23c8,&local_23e8,"&SenderCompID=");
      pSVar7 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator->(&local_1fc0);
      pSVar8 = &SessionID::getSenderCompID(pSVar7)->super_StringField;
      psVar9 = StringField::getValue_abi_cxx11_(pSVar8);
      std::operator+(&local_23a8,&local_23c8,psVar9);
      std::operator+(&local_2388,&local_23a8,"&TargetCompID=");
      pSVar7 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator->(&local_1fc0);
      pSVar8 = &SessionID::getTargetCompID(pSVar7)->super_StringField;
      psVar9 = StringField::getValue_abi_cxx11_(pSVar8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2368
                     ,&local_2388,psVar9);
      std::__cxx11::string::~string((string *)&local_2388);
      std::__cxx11::string::~string((string *)&local_23a8);
      std::__cxx11::string::~string((string *)&local_23c8);
      std::__cxx11::string::~string((string *)&local_23e8);
      pSVar7 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator->(&local_1fc0);
      SessionID::getSessionQualifier_abi_cxx11_(pSVar7);
      lVar10 = std::__cxx11::string::size();
      if (lVar10 != 0) {
        pSVar7 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator->(&local_1fc0);
        psVar9 = SessionID::getSessionQualifier_abi_cxx11_(pSVar7);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &a_4.super_TAG.m_stream,"&SessionQualifier=",psVar9);
        std::__cxx11::string::operator+=((string *)local_2368,(string *)&a_4.super_TAG.m_stream);
        std::__cxx11::string::~string((string *)&a_4.super_TAG.m_stream);
      }
      HTML::A::A((A *)local_25c0,table.super_TAG.m_stream + 0x10);
      pTVar4 = &HTML::A::href((A *)local_25c0,(string *)local_2368)->super_TAG;
      pSVar7 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator->(&local_1fc0);
      SessionID::toString_abi_cxx11_((string *)&td_8.super_TAG.m_stream,pSVar7);
      HTML::TAG::text(pTVar4,(string *)&td_8.super_TAG.m_stream);
      std::__cxx11::string::~string((string *)&td_8.super_TAG.m_stream);
      HTML::A::~A((A *)local_25c0);
      std::__cxx11::string::~string((string *)local_2368);
      HTML::TD::~TD((TD *)((long)&href.field_2 + 8));
      HTML::TD::TD((TD *)local_2798,table.super_TAG.m_stream + 0x10);
      bVar1 = Session::isInitiator(this_00);
      pcVar11 = "No sessions defined for acceptor";
      if (bVar1) {
        pcVar11 = "No sessions defined for initiator";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_27b8,pcVar11 + 0x18,
                 (allocator<char> *)((long)&td_9.super_TAG.m_stream + 7));
      HTML::TAG::text((TAG *)local_2798,&local_27b8);
      std::__cxx11::string::~string((string *)&local_27b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&td_9.super_TAG.m_stream + 7));
      HTML::TD::~TD((TD *)local_2798);
      HTML::TD::TD((TD *)local_2978,table.super_TAG.m_stream + 0x10);
      bVar1 = Session::isEnabled(this_00);
      pcVar11 = "no";
      if (bVar1) {
        pcVar11 = "yes";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2998,pcVar11,
                 (allocator<char> *)((long)&td_10.super_TAG.m_stream + 7));
      HTML::TAG::text((TAG *)local_2978,&local_2998);
      std::__cxx11::string::~string((string *)&local_2998);
      std::allocator<char>::~allocator((allocator<char> *)((long)&td_10.super_TAG.m_stream + 7));
      HTML::TD::~TD((TD *)local_2978);
      HTML::TD::TD((TD *)local_2b58,table.super_TAG.m_stream + 0x10);
      UtcTimeStamp::UtcTimeStamp(&local_2b90);
      bVar1 = Session::isSessionTime(this_00,&local_2b90);
      pcVar11 = "no";
      if (bVar1) {
        pcVar11 = "yes";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b78,pcVar11,
                 (allocator<char> *)((long)&td_11.super_TAG.m_stream + 7));
      HTML::TAG::text((TAG *)local_2b58,&local_2b78);
      std::__cxx11::string::~string((string *)&local_2b78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&td_11.super_TAG.m_stream + 7));
      UtcTimeStamp::~UtcTimeStamp(&local_2b90);
      HTML::TD::~TD((TD *)local_2b58);
      HTML::TD::TD((TD *)local_2d50,table.super_TAG.m_stream + 0x10);
      bVar1 = Session::isLoggedOn(this_00);
      pcVar11 = "no";
      if (bVar1) {
        pcVar11 = "yes";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d70,pcVar11,
                 (allocator<char> *)((long)&td_12.super_TAG.m_stream + 7));
      HTML::TAG::text((TAG *)local_2d50,&local_2d70);
      std::__cxx11::string::~string((string *)&local_2d70);
      std::allocator<char>::~allocator((allocator<char> *)((long)&td_12.super_TAG.m_stream + 7));
      HTML::TD::~TD((TD *)local_2d50);
      HTML::TD::TD((TD *)&td_13.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
      iVar2 = Session::getExpectedTargetNum(this_00);
      HTML::TAG::text((TAG *)&td_13.super_TAG.m_stream,iVar2);
      HTML::TD::~TD((TD *)&td_13.super_TAG.m_stream);
      HTML::TD::TD((TD *)local_30e8,table.super_TAG.m_stream + 0x10);
      iVar2 = Session::getExpectedSenderNum(this_00);
      HTML::TAG::text((TAG *)local_30e8,iVar2);
      HTML::TD::~TD((TD *)local_30e8);
      HTML::TR::~TR((TR *)&td_7.super_TAG.m_stream);
    }
    std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&local_1fc0);
  }
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)&i);
  HTML::TABLE::~TABLE((TABLE *)local_1e0);
  return;
}

Assistant:

void HttpConnection::processRoot
( const HttpMessage& request, std::stringstream& h, std::stringstream& b )
{
  TABLE table(b); table.border(1).cellspacing(2).width(100).text();

  { CAPTION caption(b); caption.text();
    EM em(b); em.text();
    b << Session::numSessions() << " Sessions managed by QuickFIX";
    { HR hr(b); hr.text(); }
    { b << NBSP; A a(b); a.href("/resetSessions" + request.getParameterString()).text("RESET"); }
    { b << NBSP; A a(b); a.href("/refreshSessions" + request.getParameterString()).text("REFRESH"); }
    { b << NBSP; A a(b); a.href("/enableSessions" + request.getParameterString()).text("ENABLE"); }
    { b << NBSP; A a(b); a.href("/disableSessions" + request.getParameterString()).text("DISABLE"); }
  }

  { TR tr(b); tr.text();
    { TD td(b); td.align("center").text("Session"); }
    { TD td(b); td.align("center").text("ConnectionType"); }
    { TD td(b); td.align("center").text("Enabled"); }
    { TD td(b); td.align("center").text("Session Time"); }
    { TD td(b); td.align("center").text("Logged On"); }
    { TD td(b); td.align("center").text("Next Incoming"); }
    { TD td(b); td.align("center").text("Next Outgoing"); }
  }

  std::set<SessionID> sessions = Session::getSessions();
  std::set<SessionID>::iterator i;
  for( i = sessions.begin(); i != sessions.end(); ++i )
  {
    Session* pSession = Session::lookupSession( *i );
    if( !pSession ) continue;

    { TR tr(b); tr.text();
      { TD td(b); td.text();
        std::string href = "/session?BeginString=" + i->getBeginString().getValue() +
                            "&SenderCompID=" + i->getSenderCompID().getValue() +
                            "&TargetCompID=" + i->getTargetCompID().getValue();
        if( i->getSessionQualifier().size() )
          href += "&SessionQualifier=" + i->getSessionQualifier();

        A a(b); a.href(href).text(i->toString());
      }
      { TD td(b); td.text(pSession->isInitiator() ? "initiator" : "acceptor"); }
      { TD td(b); td.text(pSession->isEnabled() ? "yes" : "no"); }
      { TD td(b); td.text(pSession->isSessionTime(UtcTimeStamp()) ? "yes" : "no"); }
      { TD td(b); td.text(pSession->isLoggedOn() ? "yes" : "no"); }
      { TD td(b); td.text(pSession->getExpectedTargetNum()); }
      { TD td(b); td.text(pSession->getExpectedSenderNum()); }
    }
  }
}